

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

bool __thiscall
testing::internal::FloatingPoint<double>::AlmostEquals
          (FloatingPoint<double> *this,FloatingPoint<double> *rhs)

{
  Bits BVar1;
  
  if (((~(this->u_).bits_ & 0x7ff0000000000000) != 0 || ((this->u_).bits_ & 0xfffffffffffff) == 0)
     && ((~(rhs->u_).bits_ & 0x7ff0000000000000) != 0 || ((rhs->u_).bits_ & 0xfffffffffffff) == 0))
  {
    BVar1 = DistanceBetweenSignAndMagnitudeNumbers((Bits *)this,(Bits *)rhs);
    return BVar1 < 5;
  }
  return false;
}

Assistant:

bool AlmostEquals(const FloatingPoint& rhs) const {
                // The IEEE standard says that any comparison operation involving
                // a NAN must return false.
                if (is_nan() || rhs.is_nan()) return false;

                return DistanceBetweenSignAndMagnitudeNumbers(u_.bits_, rhs.u_.bits_)
                    <= kMaxUlps;
            }